

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
          (SmallVectorBase<char> *this,size_type newSize,ValueInitTag *val)

{
  ulong uVar1;
  pointer pcVar2;
  
  uVar1 = this->len;
  if (uVar1 <= newSize) {
    if (newSize <= uVar1) {
      return;
    }
    if (this->cap < newSize) {
      resizeRealloc<slang::SmallVectorBase<char>::ValueInitTag>(this,newSize,val);
      return;
    }
    pcVar2 = this->data_;
    pcVar2[uVar1] = '\0';
    if (~uVar1 + newSize != 0) {
      memset(pcVar2 + uVar1 + 1,0,~uVar1 + newSize);
    }
  }
  this->len = newSize;
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                resizeRealloc(newSize, val);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::uninitialized_fill_n(end(), newSize - len, val);
            }
            else {
                std::uninitialized_value_construct_n(end(), newSize - len);
            }
            len = newSize;
        }
    }